

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::NavInitWindow(ImGuiWindow *window,bool force_reinit)

{
  ImRect *pIVar1;
  ImGuiNavLayer IVar2;
  ImGuiID IVar3;
  ImGuiContext *pIVar4;
  ImGuiContext *pIVar5;
  bool bVar6;
  byte bVar7;
  
  pIVar4 = GImGui;
  if (((uint)window->Flags >> 0x12 & 1) == 0) {
    if (((((uint)window->Flags >> 0x1a & 1) != 0) || (window->RootWindow == window)) ||
       (window->NavLastIds[0] == 0 || force_reinit)) {
      bVar7 = 1;
    }
    else {
      bVar7 = 0;
    }
    if ((GImGui->DebugLogFlags & 8) != 0) {
      DebugLog("[nav] NavInitRequest: from NavInitWindow(), init_for_nav=%d, window=\"%s\", layer=%d\n"
               ,(ulong)bVar7,window->Name,(ulong)GImGui->NavLayer);
    }
    pIVar5 = GImGui;
    if (bVar7 != 0) {
      IVar2 = pIVar4->NavLayer;
      IVar3 = window->NavRootFocusScopeId;
      GImGui->NavId = 0;
      pIVar5->NavLayer = IVar2;
      pIVar5->NavFocusScopeId = IVar3;
      pIVar5->NavWindow->NavLastIds[IVar2] = 0;
      pIVar1 = pIVar5->NavWindow->NavRectRel + IVar2;
      (pIVar1->Min).x = 0.0;
      (pIVar1->Min).y = 0.0;
      (pIVar1->Max).x = 0.0;
      (pIVar1->Max).y = 0.0;
      pIVar4->NavInitRequest = true;
      pIVar4->NavInitRequestFromMove = false;
      pIVar4->NavInitResultId = 0;
      (pIVar4->NavInitResultRectRel).Min.x = 0.0;
      (pIVar4->NavInitResultRectRel).Min.y = 0.0;
      (pIVar4->NavInitResultRectRel).Max.x = 0.0;
      (pIVar4->NavInitResultRectRel).Max.y = 0.0;
      bVar6 = true;
      if (GImGui->NavMoveScoringItems == false) {
        bVar6 = GImGui->NavInitRequest;
      }
      GImGui->NavAnyRequest = bVar6;
      return;
    }
    pIVar4->NavId = window->NavLastIds[0];
  }
  else {
    GImGui->NavId = 0;
  }
  pIVar4->NavFocusScopeId = window->NavRootFocusScopeId;
  return;
}

Assistant:

void ImGui::NavInitWindow(ImGuiWindow* window, bool force_reinit)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(window == g.NavWindow);

    if (window->Flags & ImGuiWindowFlags_NoNavInputs)
    {
        g.NavId = 0;
        g.NavFocusScopeId = window->NavRootFocusScopeId;
        return;
    }

    bool init_for_nav = false;
    if (window == window->RootWindow || (window->Flags & ImGuiWindowFlags_Popup) || (window->NavLastIds[0] == 0) || force_reinit)
        init_for_nav = true;
    IMGUI_DEBUG_LOG_NAV("[nav] NavInitRequest: from NavInitWindow(), init_for_nav=%d, window=\"%s\", layer=%d\n", init_for_nav, window->Name, g.NavLayer);
    if (init_for_nav)
    {
        SetNavID(0, g.NavLayer, window->NavRootFocusScopeId, ImRect());
        g.NavInitRequest = true;
        g.NavInitRequestFromMove = false;
        g.NavInitResultId = 0;
        g.NavInitResultRectRel = ImRect();
        NavUpdateAnyRequestFlag();
    }
    else
    {
        g.NavId = window->NavLastIds[0];
        g.NavFocusScopeId = window->NavRootFocusScopeId;
    }
}